

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v11::detail::get_dynamic_spec<fmt::v11::context>
              (arg_id_kind kind,arg_ref<char> *ref,context *ctx)

{
  undefined1 x [16];
  undefined1 x_00 [16];
  basic_string_view<char> bVar1;
  handle hVar2;
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  string_view name;
  custom_value<fmt::v11::context> custom;
  ulong uVar3;
  bool bVar4;
  make_unsigned_t<int> mVar5;
  undefined8 *in_RSI;
  int in_EDI;
  unsigned_long_long value;
  format_arg arg;
  undefined2 in_stack_fffffffffffffea8;
  undefined2 in_stack_fffffffffffffeaa;
  float in_stack_fffffffffffffeac;
  undefined2 in_stack_fffffffffffffeb0;
  undefined6 in_stack_fffffffffffffeb2;
  context *in_stack_fffffffffffffec0;
  context *this;
  char *in_stack_fffffffffffffec8;
  size_t in_stack_fffffffffffffed0;
  dynamic_spec_getter *in_stack_fffffffffffffed8;
  undefined1 local_101 [25];
  uint128_opt *local_e8;
  undefined2 uStack_e0;
  undefined6 uStack_de;
  undefined4 local_d8;
  bool local_c1 [9];
  undefined8 *local_b8;
  int local_b0;
  monostate local_a9 [17];
  handle local_98;
  basic_string_view<char> local_88;
  uint128_opt *local_78;
  uint128_opt *local_68;
  int128_opt *local_48;
  int128_opt *local_38;
  context *local_18;
  uint128_opt **local_10;
  ulong local_8;
  
  local_c1[0] = in_EDI != 0;
  local_b8 = in_RSI;
  local_b0 = in_EDI;
  ignore_unused<bool,char[1]>(local_c1,(char (*) [1])0xc8d54a);
  if (local_b0 == 1) {
    v11::context::arg((context *)CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0),
                      (int)in_stack_fffffffffffffeac);
  }
  else {
    local_101._9_8_ = *local_b8;
    local_101._17_8_ = local_b8[1];
    name.size_ = in_stack_fffffffffffffed0;
    name.data_ = in_stack_fffffffffffffec8;
    v11::context::arg(in_stack_fffffffffffffec0,name);
  }
  bVar4 = basic_format_arg::operator_cast_to_bool((basic_format_arg *)&local_e8);
  if (!bVar4) {
    report_error((char *)in_stack_fffffffffffffec0);
  }
  local_10 = &local_e8;
  this = (context *)local_101;
  bVar4 = SUB41((uint)in_stack_fffffffffffffeac >> 0x18,0);
  local_18 = this;
  switch(local_d8) {
  case 0:
  default:
    monostate::monostate(local_a9);
    local_8 = dynamic_spec_getter::operator()<fmt::v11::monostate,_0>((dynamic_spec_getter *)this);
    in_stack_fffffffffffffec0 = this;
    break;
  case 1:
    local_8 = dynamic_spec_getter::operator()<int,_0>
                        ((dynamic_spec_getter *)
                         CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0),
                         (int)in_stack_fffffffffffffeac);
    break;
  case 2:
    local_8 = dynamic_spec_getter::operator()<unsigned_int,_0>
                        ((dynamic_spec_getter *)
                         CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0),
                         (uint)in_stack_fffffffffffffeac);
    break;
  case 3:
    local_8 = dynamic_spec_getter::operator()<long_long,_0>
                        ((dynamic_spec_getter *)
                         CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0),
                         CONCAT44(in_stack_fffffffffffffeac,
                                  CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)));
    break;
  case 4:
    local_8 = dynamic_spec_getter::operator()<unsigned_long_long,_0>
                        ((dynamic_spec_getter *)
                         CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0),
                         CONCAT44(in_stack_fffffffffffffeac,
                                  CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)));
    break;
  case 5:
    x._2_2_ = in_stack_fffffffffffffeaa;
    x._0_2_ = in_stack_fffffffffffffea8;
    x._4_4_ = in_stack_fffffffffffffeac;
    x._8_2_ = in_stack_fffffffffffffeb0;
    x._10_6_ = in_stack_fffffffffffffeb2;
    local_48 = map((int128_opt *)local_e8,(int128_opt)x);
    value_00._8_8_ = in_stack_fffffffffffffec8;
    value_00._0_8_ = in_stack_fffffffffffffec0;
    local_38 = local_48;
    local_8 = dynamic_spec_getter::operator()<__int128,_0>
                        (in_stack_fffffffffffffed8,(__int128)value_00);
    break;
  case 6:
    x_00._2_2_ = in_stack_fffffffffffffeaa;
    x_00._0_2_ = in_stack_fffffffffffffea8;
    x_00._4_4_ = in_stack_fffffffffffffeac;
    x_00._8_2_ = in_stack_fffffffffffffeb0;
    x_00._10_6_ = in_stack_fffffffffffffeb2;
    local_78 = map(local_e8,(uint128_opt)x_00);
    value_01._8_8_ = in_stack_fffffffffffffec8;
    value_01._0_8_ = in_stack_fffffffffffffec0;
    local_68 = local_78;
    local_8 = dynamic_spec_getter::operator()<unsigned___int128,_0>
                        ((dynamic_spec_getter *)this,(unsigned___int128)value_01);
    break;
  case 7:
    local_8 = dynamic_spec_getter::operator()<bool,_0>
                        ((dynamic_spec_getter *)
                         CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0),bVar4);
    break;
  case 8:
    local_8 = dynamic_spec_getter::operator()<char,_0>
                        ((dynamic_spec_getter *)
                         CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0),bVar4);
    break;
  case 9:
    local_8 = dynamic_spec_getter::operator()<float,_0>
                        ((dynamic_spec_getter *)
                         CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0),
                         in_stack_fffffffffffffeac);
    break;
  case 10:
    local_8 = dynamic_spec_getter::operator()<double,_0>
                        ((dynamic_spec_getter *)
                         CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0),
                         (double)CONCAT44(in_stack_fffffffffffffeac,
                                          CONCAT22(in_stack_fffffffffffffeaa,
                                                   in_stack_fffffffffffffea8)));
    break;
  case 0xb:
    local_8 = dynamic_spec_getter::operator()<long_double,_0>
                        ((dynamic_spec_getter *)CONCAT62(in_stack_fffffffffffffeb2,uStack_e0),
                         (longdouble)CONCAT28((short)local_e8,0x25d657));
    break;
  case 0xc:
    local_8 = dynamic_spec_getter::operator()<const_char_*,_0>
                        ((dynamic_spec_getter *)
                         CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0),
                         (char *)CONCAT44(in_stack_fffffffffffffeac,
                                          CONCAT22(in_stack_fffffffffffffeaa,
                                                   in_stack_fffffffffffffea8)));
    break;
  case 0xd:
    local_88 = string_value<char>::str((string_value<char> *)0x25d69d);
    bVar1.data_._2_2_ = in_stack_fffffffffffffeaa;
    bVar1.data_._0_2_ = in_stack_fffffffffffffea8;
    bVar1.data_._4_4_ = in_stack_fffffffffffffeac;
    bVar1.size_._0_2_ = in_stack_fffffffffffffeb0;
    bVar1.size_._2_6_ = in_stack_fffffffffffffeb2;
    local_8 = dynamic_spec_getter::operator()<fmt::v11::basic_string_view<char>,_0>
                        ((dynamic_spec_getter *)0x25d6c7,bVar1);
    break;
  case 0xe:
    local_8 = dynamic_spec_getter::operator()<const_void_*,_0>
                        ((dynamic_spec_getter *)
                         CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0),
                         (void *)CONCAT44(in_stack_fffffffffffffeac,
                                          CONCAT22(in_stack_fffffffffffffeaa,
                                                   in_stack_fffffffffffffea8)));
    break;
  case 0xf:
    custom.format._0_2_ = uStack_e0;
    custom.value = local_e8;
    custom.format._2_6_ = uStack_de;
    basic_format_arg<fmt::v11::context>::handle::handle(&local_98,custom);
    hVar2.custom_.value._2_2_ = in_stack_fffffffffffffeaa;
    hVar2.custom_.value._0_2_ = in_stack_fffffffffffffea8;
    hVar2.custom_.value._4_4_ = in_stack_fffffffffffffeac;
    hVar2.custom_.format._0_2_ = in_stack_fffffffffffffeb0;
    hVar2.custom_.format._2_6_ = in_stack_fffffffffffffeb2;
    local_8 = dynamic_spec_getter::
              operator()<fmt::v11::basic_format_arg<fmt::v11::context>::handle,_0>
                        ((dynamic_spec_getter *)0x25d756,hVar2);
  }
  uVar3 = local_8;
  local_101._1_8_ = local_8;
  max_value<int>();
  mVar5 = to_unsigned<int>(0);
  if (uVar3 <= mVar5) {
    return (int)local_101._1_8_;
  }
  report_error((char *)in_stack_fffffffffffffec0);
}

Assistant:

FMT_CONSTEXPR int get_dynamic_spec(
    arg_id_kind kind, const arg_ref<typename Context::char_type>& ref,
    Context& ctx) {
  FMT_ASSERT(kind != arg_id_kind::none, "");
  auto arg =
      kind == arg_id_kind::index ? ctx.arg(ref.index) : ctx.arg(ref.name);
  if (!arg) report_error("argument not found");
  unsigned long long value = arg.visit(dynamic_spec_getter());
  if (value > to_unsigned(max_value<int>()))
    report_error("width/precision is out of range");
  return static_cast<int>(value);
}